

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_read(char *data,uint8_t *buf,size_t count,lyb_state *lybs)

{
  uint8_t uVar1;
  uint __line;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__assertion;
  ulong uVar5;
  ulong uVar6;
  ulong __n;
  
  if ((data != (char *)0x0) && (lybs != (lyb_state *)0x0)) {
    iVar2 = 0;
    do {
      uVar5 = (ulong)(uint)lybs->used;
      if (lybs->used < 1) {
        uVar5 = 0;
      }
      uVar6 = 0xffffffff;
      __n = count;
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        if ((lybs->written[uVar3] <= __n) && (lybs->position[uVar3] != 0)) {
          uVar6 = uVar3 & 0xffffffff;
          __n = lybs->written[uVar3];
        }
      }
      if (((int)uVar6 == -1) && (count == 0)) {
        return iVar2;
      }
      if (__n != 0) {
        if (buf != (uint8_t *)0x0) {
          memcpy(buf,data + iVar2,__n);
          uVar5 = (ulong)(uint)lybs->used;
          if (lybs->used < 1) {
            uVar5 = 0;
          }
        }
        uVar3 = 0;
        while (uVar5 != uVar3) {
          uVar4 = lybs->written[uVar3] - __n;
          lybs->written[uVar3] = uVar4;
          uVar3 = uVar3 + 1;
          if (0xff < uVar4) {
            __assertion = "lybs->written[i] <= LYB_SIZE_MAX";
            __line = 0x52;
            goto LAB_00140e7a;
          }
        }
        count = count - __n;
        if (buf != (uint8_t *)0x0) {
          buf = buf + __n;
        }
        iVar2 = iVar2 + (int)__n;
      }
      if (-1 < (int)uVar6) {
        uVar1 = data[(long)iVar2 + 1];
        lybs->written[uVar6] = (ulong)(byte)data[iVar2];
        lybs->inner_chunks[uVar6] = uVar1;
        lybs->position[uVar6] = (ulong)(lybs->written[uVar6] == 0xff);
        iVar2 = iVar2 + 2;
      }
    } while( true );
  }
  __assertion = "data && lybs";
  __line = 0x35;
LAB_00140e7a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                ,__line,"int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
}

Assistant:

static int
lyb_read(const char *data, uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, empty_chunk_i;
    size_t to_read;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(data && lybs);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybs->written[i] <= to_read) && lybs->position[i]) {
                /* empty chunk, do not read more */
                to_read = lybs->written[i];
                empty_chunk_i = i;
            }
        }

        if ((empty_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                memcpy(buf, data + ret, to_read);
            }

            for (i = 0; i < lybs->used; ++i) {
                /* decrease all written counters */
                lybs->written[i] -= to_read;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }

            ret += to_read;
        }

        if (empty_chunk_i > -1) {
            /* read the next chunk meta information */
            memcpy(meta_buf, data + ret, LYB_META_BYTES);
            lybs->written[empty_chunk_i] = meta_buf[0];
            lybs->inner_chunks[empty_chunk_i] = meta_buf[1];

            /* remember whether there is a following chunk or not */
            lybs->position[empty_chunk_i] = (lybs->written[empty_chunk_i] == LYB_SIZE_MAX ? 1 : 0);

            ret += LYB_META_BYTES;
        }
    }

    return ret;
}